

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_map.cpp
# Opt level: O0

void __thiscall tst_qpromise_map::convertValues(tst_qpromise_map *this)

{
  initializer_list<QString> args;
  initializer_list<int> args_00;
  Type TVar1;
  QString *local_148;
  QString local_118;
  QString local_100;
  QString local_e8;
  undefined1 local_d0 [40];
  QList<QString> local_a8;
  QList<QString> local_90;
  int local_64 [3];
  iterator local_58;
  undefined8 local_50;
  QList<int> local_48;
  QPromise<QList<int>_> local_30;
  undefined1 local_20 [8];
  PromiseType p;
  tst_qpromise_map *this_local;
  
  local_64[0] = 0x2a;
  local_64[1] = 0x2b;
  local_64[2] = 0x2c;
  local_58 = local_64;
  local_50 = 3;
  args_00._M_len = 3;
  args_00._M_array = local_58;
  p.super_QPromiseBase<QList<QString>_>.m_d.d = (PromiseData<QList<QString>_> *)this;
  QList<int>::QList(&local_48,args_00);
  TVar1 = QtPromise::resolve<QList<int>>((QtPromise *)&local_30,&local_48);
  QtPromise::QPromise<QList<int>>::map<tst_qpromise_map::convertValues()::__0>
            ((QPromise<QList<int>> *)local_20,&local_30,
             TVar1.super_QPromiseBase<QList<int>_>.m_d.d.d);
  QtPromise::QPromise<QList<int>_>::~QPromise(&local_30);
  QList<int>::~QList(&local_48);
  local_a8.d.d = (Data *)0x0;
  local_a8.d.ptr = (QString *)0x0;
  local_a8.d.size = 0;
  QList<QString>::QList(&local_a8);
  waitForValue<QList<QString>>(&local_90,(QPromise<QList<QString>_> *)local_20,&local_a8);
  QString::QString(&local_118,"43");
  QString::QString(&local_100,"44");
  QString::QString(&local_e8,"45");
  local_d0._0_8_ = &local_118;
  local_d0._8_8_ = (char16_t *)0x3;
  args._M_len = 3;
  args._M_array = (iterator)local_d0._0_8_;
  QList<QString>::QList((QList<QString> *)(local_d0 + 0x10),args);
  QTest::qCompare<QString>
            (&local_90,(QList<QString> *)(local_d0 + 0x10),"waitForValue(p, QVector<QString>{})",
             "(QVector<QString>{\"43\", \"44\", \"45\"})",
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_map.cpp"
             ,0x58);
  QList<QString>::~QList((QList<QString> *)(local_d0 + 0x10));
  local_148 = (QString *)local_d0;
  do {
    local_148 = local_148 + -1;
    QString::~QString(local_148);
  } while (local_148 != &local_118);
  QList<QString>::~QList(&local_90);
  QList<QString>::~QList(&local_a8);
  QtPromise::QPromise<QList<QString>_>::~QPromise((QPromise<QList<QString>_> *)local_20);
  return;
}

Assistant:

void tst_qpromise_map::convertValues()
{
    auto p = QtPromise::resolve(QVector<int>{42, 43, 44}).map([](int v, ...) {
        return QString::number(v + 1);
    });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<QString>>>::value));
    QCOMPARE(waitForValue(p, QVector<QString>{}), (QVector<QString>{"43", "44", "45"}));
}